

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O1

bool __thiscall
cmExportCommand::HandlePackage
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  cmMakefile *this_00;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  char *content;
  ostream *poVar6;
  ulong uVar7;
  string package;
  string hash;
  RegularExpression packageRegex;
  allocator local_2b9;
  string local_2b8;
  string local_298;
  undefined1 local_278 [112];
  ios_base local_208 [264];
  undefined1 local_100 [184];
  char *local_48;
  
  paVar1 = &local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  local_298._M_dataplus._M_p = (pointer)paVar1;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    uVar7 = 1;
    do {
      if (uVar7 == 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"PACKAGE given unknown argument: ",0x20);
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,pbVar3[2]._M_dataplus._M_p,pbVar3[2]._M_string_length);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_100);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        goto LAB_0029a359;
      }
      std::__cxx11::string::_M_assign((string *)&local_298);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_298._M_string_length == 0) {
    local_278._0_8_ = local_278 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"PACKAGE must be given a package name.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_278);
    if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
LAB_0029a359:
    bVar4 = false;
  }
  else {
    local_48 = (char *)0x0;
    cmsys::RegularExpression::compile((RegularExpression *)local_100,"^[A-Za-z0-9_.-]+$");
    bVar4 = cmsys::RegularExpression::find
                      ((RegularExpression *)local_100,local_298._M_dataplus._M_p);
    if (bVar4) {
      this_00 = (this->super_cmCommand).Makefile;
      pcVar2 = local_278 + 0x10;
      local_278._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY","");
      bVar5 = cmMakefile::IsOn(this_00,(string *)local_278);
      if ((char *)local_278._0_8_ != pcVar2) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      if (!bVar5) {
        content = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)&local_2b8,content,&local_2b9);
        cmSystemTools::ComputeStringMD5((string *)local_278,&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        StorePackageRegistryDir(this,&local_298,content,(char *)local_278._0_8_);
        if ((char *)local_278._0_8_ != pcVar2) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"PACKAGE given invalid package name \"",0x24);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_278,local_298._M_dataplus._M_p,local_298._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".  ",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Package names must match \"",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"^[A-Za-z0-9_.-]+$",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
      std::ios_base::~ios_base(local_208);
    }
    if (local_48 != (char *)0x0) {
      operator_delete__(local_48);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool cmExportCommand::HandlePackage(std::vector<std::string> const& args)
{
  // Parse PACKAGE mode arguments.
  enum Doing
  {
    DoingNone,
    DoingPackage
  };
  Doing doing = DoingPackage;
  std::string package;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (doing == DoingPackage) {
      package = args[i];
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "PACKAGE given unknown argument: " << args[i];
      this->SetError(e.str());
      return false;
    }
  }

  // Verify the package name.
  if (package.empty()) {
    this->SetError("PACKAGE must be given a package name.");
    return false;
  }
  const char* packageExpr = "^[A-Za-z0-9_.-]+$";
  cmsys::RegularExpression packageRegex(packageExpr);
  if (!packageRegex.find(package.c_str())) {
    std::ostringstream e;
    e << "PACKAGE given invalid package name \"" << package << "\".  "
      << "Package names must match \"" << packageExpr << "\".";
    this->SetError(e.str());
    return false;
  }

  // If the CMAKE_EXPORT_NO_PACKAGE_REGISTRY variable is set the command
  // export(PACKAGE) does nothing.
  if (this->Makefile->IsOn("CMAKE_EXPORT_NO_PACKAGE_REGISTRY")) {
    return true;
  }

  // We store the current build directory in the registry as a value
  // named by a hash of its own content.  This is deterministic and is
  // unique with high probability.
  const char* outDir = this->Makefile->GetCurrentBinaryDirectory();
  std::string hash = cmSystemTools::ComputeStringMD5(outDir);
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->StorePackageRegistryWin(package, outDir, hash.c_str());
#else
  this->StorePackageRegistryDir(package, outDir, hash.c_str());
#endif

  return true;
}